

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.c
# Opt level: O3

lws_mqtt_str_t * lws_mqtt_str_create_init(uint8_t *buf,uint16_t len,uint16_t lim)

{
  lws_mqtt_str_t *plVar1;
  uint uVar2;
  undefined6 in_register_00000012;
  
  uVar2 = (uint)CONCAT62(in_register_00000012,lim);
  if (uVar2 == 0) {
    uVar2 = (uint)len;
  }
  plVar1 = lws_mqtt_str_create((uint16_t)uVar2);
  if (plVar1 != (lws_mqtt_str_t *)0x0) {
    memcpy(plVar1->buf,buf,(ulong)len);
    plVar1->len = len;
    plVar1->len_valid = '\x01';
    plVar1->pos = len;
  }
  return plVar1;
}

Assistant:

lws_mqtt_str_t *
lws_mqtt_str_create_init(uint8_t *buf, uint16_t len, uint16_t lim)
{
	lws_mqtt_str_t *s;

	if (!lim)
		lim = len;

	s = lws_mqtt_str_create(lim);

	if (!s)
		return NULL;

	memcpy(s->buf, buf, len);
	s->len = len;
	s->len_valid = 1;
	s->pos = len;

	return s;
}